

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O3

int x509_check_issued_with_callback(X509_STORE_CTX *ctx,X509 *x,X509 *issuer)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = X509_check_issued((X509 *)issuer,(X509 *)x);
  if (iVar1 == 0) {
    uVar2 = 1;
  }
  else {
    uVar2 = 0;
    if ((ctx->param->flags & 1) != 0) {
      ctx->error = iVar1;
      ctx->current_cert = x;
      uVar2 = (*ctx->verify_cb)(0,ctx);
      if (1 < uVar2) {
        abort();
      }
    }
  }
  return uVar2;
}

Assistant:

int x509_check_issued_with_callback(X509_STORE_CTX *ctx, X509 *x,
                                    X509 *issuer) {
  int ret;
  ret = X509_check_issued(issuer, x);
  if (ret == X509_V_OK) {
    return 1;
  }
  // If we haven't asked for issuer errors don't set ctx
  if (!(ctx->param->flags & X509_V_FLAG_CB_ISSUER_CHECK)) {
    return 0;
  }

  ctx->error = ret;
  ctx->current_cert = x;
  return call_verify_cb(0, ctx);
}